

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O2

string * __thiscall
cmList::
Join<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
          (string *__return_storage_ptr__,cmList *this,
          __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          first,__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                last,string_view glue)

{
  string *psVar1;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *s;
  string sep;
  allocator<char> local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40 [32];
  
  local_50._M_str = (char *)glue._M_len;
  if ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)this
      == first._M_current) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_50._M_len = (size_t)last._M_current;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_40,&local_50,&local_51);
    psVar1 = ToString((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
    for (s = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(this + 2); s != first._M_current; s = s + 1) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      ToString(s);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Join(InputIterator first, InputIterator last,
                          cm::string_view glue)
  {
    if (first == last) {
      return std::string{};
    }

    const auto sep = std::string{ glue };

    std::string joined = cmList::ToString(*first);
    for (auto it = std::next(first); it != last; ++it) {
      joined += sep;
      joined += cmList::ToString(*it);
    }

    return joined;
  }